

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-linked_ptr.h
# Opt level: O2

void __thiscall testing::internal::linked_ptr<InotifyEvent>::depart(linked_ptr<InotifyEvent> *this)

{
  InotifyEvent *pIVar1;
  bool bVar2;
  
  bVar2 = linked_ptr_internal::depart(&this->link_);
  if (bVar2) {
    pIVar1 = this->value_;
    if (pIVar1 != (InotifyEvent *)0x0) {
      std::__cxx11::string::~string((string *)&pIVar1->path);
    }
    operator_delete(pIVar1,0x28);
    return;
  }
  return;
}

Assistant:

void depart() {
    if (link_.depart()) delete value_;
  }